

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O0

void server_check_hangup(void *server_void)

{
  double dVar1;
  bool bVar2;
  reference ppCVar3;
  double dVar4;
  IPAddress local_54;
  EOClient *local_50;
  EOClient *client;
  Client *rawclient;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  double delay;
  double now;
  EOServer *server;
  void *server_void_local;
  
  dVar4 = Timer::GetTime();
  dVar1 = *(double *)((long)server_void + 0xa8);
  __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin
                     ((list<Client_*,_std::allocator<Client_*>_> *)((long)server_void + 0x38));
  rawclient = (Client *)
              std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end
                        ((list<Client_*,_std::allocator<Client_*>_> *)((long)server_void + 0x38));
  while (bVar2 = std::operator!=(&__end1,(_Self *)&rawclient), bVar2) {
    ppCVar3 = std::_List_iterator<Client_*>::operator*(&__end1);
    local_50 = (EOClient *)*ppCVar3;
    client = local_50;
    bVar2 = Client::Connected((Client *)local_50);
    if (((bVar2) && (bVar2 = Client::Accepted(&local_50->super_Client), !bVar2)) &&
       (local_50->start + dVar1 < dVar4)) {
      local_54 = Client::GetRemoteAddr(&local_50->super_Client);
      EOServer::RecordClientRejection((EOServer *)server_void,&local_54,"hanging up on idle client")
      ;
      Client::Close(&local_50->super_Client,true);
    }
    std::_List_iterator<Client_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void server_check_hangup(void *server_void)
{
	EOServer *server = static_cast<EOServer *>(server_void);

	double now = Timer::GetTime();
	double delay = server->HangupDelay;

	UTIL_FOREACH(server->clients, rawclient)
	{
		EOClient *client = static_cast<EOClient *>(rawclient);

		if (client->Connected() && !client->Accepted() && client->start + delay < now)
		{
			server->RecordClientRejection(client->GetRemoteAddr(), "hanging up on idle client");
			client->Close(true);
		}
	}
}